

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O2

void __thiscall tst_helpers_connect::rejectOneSenderDestroyed(tst_helpers_connect *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar3;
  char cVar4;
  bool bVar5;
  Object *this_00;
  QThread *p_00;
  QObject *pQVar6;
  QEvent *this_01;
  PromiseDataBase<void,_void_()> *this_02;
  PromiseData<int> *this_03;
  undefined8 uVar7;
  char *reject;
  bool result;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_148;
  PromiseResolver<int> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_138;
  _Any_data local_130;
  undefined **local_120;
  PromiseData<int> *local_118;
  bool local_109;
  PromiseResolver<void> resolver;
  QPromiseBase<void> local_f8;
  QPromiseBase<int> local_e8;
  QPromise<int> p_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_c8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_c0;
  QPromiseBase<int> local_b8;
  _Any_data local_a8;
  _Manager_type local_98;
  _Invoker_type p_Stack_90;
  Object *sender;
  PromiseFromSignal<void_(Object::*)(int,_const_QString_&)> p;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  this_00 = (Object *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)&this_00->field_0x8 = 0;
  *(undefined8 *)&this_00->m_connections = 0;
  Object::Object(this_00);
  sender = this_00;
  p_00 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&local_130,p_00);
  if ((((Data *)local_130._M_unused._0_8_ != (Data *)0x0) &&
      ((Data *)local_130._8_8_ != (Data *)0x0 &&
       *(int *)(local_130._M_unused._M_function_pointer + 4) != 0)) &&
     (cVar4 = QThread::isFinished(), cVar4 == '\0')) {
    if (((Data *)local_130._M_unused._0_8_ == (Data *)0x0) ||
       (uVar7 = local_130._8_8_, *(int *)(local_130._M_unused._M_function_pointer + 4) == 0)) {
      uVar7 = (Data *)0x0;
    }
    pQVar6 = (QObject *)QAbstractEventDispatcher::instance((QThread *)uVar7);
    if ((pQVar6 != (QObject *)0x0) || (cVar4 = QCoreApplication::closingDown(), cVar4 == '\0')) {
      this_01 = (QEvent *)operator_new(0x18);
      QEvent::QEvent(this_01,None);
      *(undefined ***)this_01 = &PTR__Event_001274b0;
      *(Object ***)(this_01 + 0x10) = &sender;
      QCoreApplication::postEvent(pQVar6,this_01,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_130);
  QtPromise::connect<Object,void(Object::*)(int,QString_const&)>
            ((Object *)&p,(offset_in_Object_to_subr)sender);
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_130._M_pod_data[0] = bVar5;
  local_a8._M_pod_data[0] = 1;
  reject = 
  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
  ;
  bVar5 = QTest::qCompare<bool,bool>
                    ((bool *)local_130._M_pod_data,(bool *)local_a8._M_pod_data,"p.isPending()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0x8b);
  if (bVar5) {
    result = false;
    p_1.super_QPromiseBase<int>.m_d = p.super_QPromiseBase<int>.m_d;
    if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    p_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127a58;
    local_f8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001276e0;
    this_02 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
    (this_02->m_catchers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_02->m_catchers).d.size = 0;
    (this_02->m_handlers).d.size = 0;
    (this_02->m_catchers).d.d = (Data *)0x0;
    (this_02->m_handlers).d.d = (Data *)0x0;
    (this_02->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
    *(undefined8 *)&this_02->m_lock = 0;
    *(undefined8 *)&this_02->m_settled = 0;
    ((PromiseDataBase<void,_void_()> *)&this_02->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&this_02->super_QSharedData = 0;
    (this_02->m_error).m_data._M_exception_object = (void *)0x0;
    QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_02);
    LOCK();
    (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (this_02 != (PromiseDataBase<void,_void_()> *)0x0) {
      LOCK();
      (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
           ._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8._M_unused._M_object = &PTR__QPromiseBase_00127770;
    local_f8.m_d.d = (PromiseData<void> *)this_02;
    local_a8._8_8_ = this_02;
    QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_a8);
    QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_a8);
    QVar3 = p_1.super_QPromiseBase<int>.m_d;
    if (resolver.m_d.d == (Data *)0x0) {
      resolver.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
    if (resolver.m_d.d == (Data *)0x0) {
      local_148.d = (Data *)0x0;
    }
    else {
      LOCK();
      (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_148.d = (Data *)resolver.m_d.d;
    }
    local_138.d = (Data *)0x0;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_148.d != (Data *)0x0) {
      LOCK();
      ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_130._M_unused._0_8_ = resolver.m_d.d;
    local_130._8_8_ = local_148.d;
    local_e8._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
    local_48._M_unused._M_object = operator_new(0x18);
    *(void **)local_48._M_unused._0_8_ = local_130._M_unused._M_object;
    if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + 1;
      UNLOCK();
    }
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = local_130._8_8_;
    if ((Data *)local_130._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + 1;
      UNLOCK();
    }
    pcStack_30 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    QtPromisePrivate::
    PromiseHandler<int,QtPromise::QPromiseBase<int>::tapFail<waitForRejected<QtPromise::QPromiseContextException,QtPromise::QPromise<int>>(QtPromise::QPromise<int>const&)::{lambda(int_const&)#1}(QtPromise::QPromiseContextException_const&)#1}>(waitForRejected<QtPromise::QPromiseContextException,QtPromise::QPromise<int>>(QtPromise::QPromise<int>const&)::{lambda(int_const&)#1}(QtPromise::QPromiseContextException_const&)#1})const::{lambda(int_const&)#1}()#1},void>
    ::
    create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromiseBase<int>::tapFail<waitForRejected<QtPromise::QPromiseContextException,QtPromise::QPromise<int>>(QtPromise::QPromise<int>const&)::{lambda(int_const&)#1}(QtPromise::QPromiseContextException_const&)#1}>(waitForRejected<QtPromise::QPromiseContextException,QtPromise::QPromise<int>>(QtPromise::QPromise<int>const&)::{lambda(int_const&)#1}(QtPromise::QPromiseContextException_const&)#1})const::{lambda(int_const&)#1}()#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
    ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)&local_130);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
              (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_int_&)> *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    QVar3 = p_1.super_QPromiseBase<int>.m_d;
    local_130._M_unused._M_object = local_e8._vptr_QPromiseBase;
    if ((Data *)local_e8._vptr_QPromiseBase != (Data *)0x0) {
      LOCK();
      (((QSharedData *)local_e8._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)local_e8._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_130._8_8_ = local_148.d;
    if (local_148.d != (Data *)0x0) {
      LOCK();
      ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_120 = (undefined **)&result;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_58 = (code *)0x0;
    pcStack_50 = (code *)0x0;
    local_68._M_unused._M_object = operator_new(0x18);
    *(void **)local_68._M_unused._0_8_ = local_130._M_unused._M_object;
    if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + 1;
      UNLOCK();
    }
    *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = local_130._8_8_;
    if ((Data *)local_130._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + 1;
      UNLOCK();
    }
    *(undefined ***)((long)local_68._M_unused._0_8_ + 0x10) = local_120;
    pcStack_50 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
    QtPromisePrivate::
    PromiseCatcher<int,waitForRejected<QtPromise::QPromiseContextException,QtPromise::QPromise<int>>(QtPromise::QPromise<int>const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QtPromise::QPromiseContextException_const&)#1},QtPromise::QPromiseContextException_const&>
    ::
    create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForRejected<QtPromise::QPromiseContextException,QtPromise::QPromise<int>>(QtPromise::QPromise<int>const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QtPromise::QPromiseContextException_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
    ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
              ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&local_130);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
              (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
               &local_148);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
               &local_138);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
               &local_e8);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
               &resolver_1);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
    ~QExplicitlySharedDataPointer(&resolver.m_d);
    local_f8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127770;
    bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p_1.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    if (!bVar5) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&(p_1.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>);
    }
    local_e8.m_d.d = p_1.super_QPromiseBase<int>.m_d.d;
    if (p_1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
                ).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127a58;
    local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127740;
    this_03 = (PromiseData<int> *)operator_new(0x68);
    (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (this_03->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
    *(undefined8 *)&(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (this_03->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (this_03->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<int>::PromiseData(this_03);
    LOCK();
    pQVar1 = &(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (this_03 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(this_03->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
         &PTR__QPromiseBase_00127a58;
    local_b8.m_d.d = this_03;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&resolver);
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver);
    QVar2.d = local_f8.m_d.d;
    if (resolver_1.m_d.d == (Data *)0x0) {
      local_148.d = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      local_148 = resolver_1.m_d.d;
    }
    local_138.d = (Data *)0x0;
    if (local_148.d == (Data *)0x0) {
      local_130._8_8_ = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_130._8_8_ = local_148.d;
    }
    local_c8.d = (Data *)0x0;
    if (local_148.d != (Data *)0x0) {
      LOCK();
      ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((Data *)local_130._8_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_130._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_130._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_118 = local_e8.m_d.d;
    if (local_e8.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_e8.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData
      ;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_120 = &PTR__QPromiseBase_00127a58;
    local_a8._M_unused._M_object = (_func_int **)0x0;
    local_a8._8_8_ = (PromiseData<void> *)0x0;
    local_98 = (_Manager_type)0x0;
    p_Stack_90 = (_Invoker_type)0x0;
    local_130._M_unused._0_8_ = (undefined8)local_148.d;
    local_c0.d = (Data *)local_130._8_8_;
    local_a8._M_unused._M_object = operator_new(0x20);
    *(void **)local_a8._M_unused._0_8_ = local_130._M_unused._M_object;
    if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + 1;
      UNLOCK();
    }
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = local_130._8_8_;
    if ((Data *)local_130._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + 1;
      UNLOCK();
    }
    *(undefined ***)((long)local_a8._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_00127740;
    *(PromiseData<int> **)((long)local_a8._M_unused._0_8_ + 0x18) = local_118;
    if (local_118 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(local_118->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    *(undefined ***)((long)local_a8._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_00127a58;
    p_Stack_90 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
    QtPromisePrivate::
    PromiseHandler<void,QtPromise::QPromiseBase<int>::tapFail<waitForRejected<QtPromise::QPromiseContextException,QtPromise::QPromise<int>>(QtPromise::QPromise<int>const&)::{lambda()#1}(QtPromise::QPromiseContextException_const&)#1}>(waitForRejected<QtPromise::QPromiseContextException,QtPromise::QPromise<int>>(QtPromise::QPromise<int>const&)::{lambda()#1}(QtPromise::QPromiseContextException_const&)#1})const::{lambda()#1}()#2},void>
    ::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromiseBase<int>::tapFail<waitForRejected<QtPromise::QPromiseContextException,QtPromise::QPromise<int>>(QtPromise::QPromise<int>const&)::{lambda()#1}(QtPromise::QPromiseContextException_const&)#1}>(waitForRejected<QtPromise::QPromiseContextException,QtPromise::QPromise<int>>(QtPromise::QPromise<int>const&)::{lambda()#1}(QtPromise::QPromiseContextException_const&)#1})const::{lambda()#1}()#2}const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
    ::{lambda()#1}::~function((_lambda___1_ *)&local_130);
    QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
              (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,(function<void_()> *)&local_a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_a8);
    QVar2.d = local_f8.m_d.d;
    QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
              ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_130,
               (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_148,
               (QPromiseResolve<int> *)&local_c0,(QPromiseReject<void> *)reject);
    QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
              (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
               (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_130);
    std::_Function_base::~_Function_base((_Function_base *)&local_130);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_c0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_c8);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_148);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_138);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_1.m_d);
    local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127a58;
    bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                      (&(local_f8.m_d.d)->super_PromiseDataBase<void,_void_()>);
    if (!bVar5) {
      QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
                (&(local_f8.m_d.d)->super_PromiseDataBase<void,_void_()>);
    }
    QtPromise::QPromiseBase<int>::~QPromiseBase(&local_e8);
    QtPromise::QPromiseBase<void>::~QPromiseBase(&local_f8);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&p_1.super_QPromiseBase<int>);
    QtPromise::QPromiseBase<int>::wait((QPromiseBase<int> *)&resolver,&local_b8);
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&local_b8);
    local_109 = result;
    resolver.m_d.d._0_1_ = 1;
    QTest::qCompare<bool,bool>
              (&local_109,(bool *)&resolver,
               "waitForRejected<QtPromise::QPromiseContextException>(p)","true",
               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
               ,0x8c);
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_helpers_connect::rejectOneSenderDestroyed()
{
    auto sender = new Object{};
    QtPromisePrivate::qtpromise_defer([&]() {
        sender->deleteLater();
    });

    auto p = QtPromise::connect(sender, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForRejected<QtPromise::QPromiseContextException>(p), true);
}